

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_authentication(Curl_easy *data)

{
  _Bool _Var1;
  saslprogress local_34;
  anon_union_280_8_fcbf97e8_for_proto *paStack_30;
  saslprogress progress;
  smtp_conn *smtpc;
  connectdata *conn;
  Curl_easy *pCStack_18;
  CURLcode result;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  smtpc = (smtp_conn *)data->conn;
  paStack_30 = &((connectdata *)smtpc)->proto;
  pCStack_18 = data;
  if (((*(byte *)((long)&((connectdata *)smtpc)->proto + 0xd0) >> 4 & 1) == 0) ||
     (_Var1 = Curl_sasl_can_authenticate(&(((connectdata *)smtpc)->proto).imapc.sasl,data), !_Var1))
  {
    smtp_state(pCStack_18,SMTP_STOP);
    data_local._4_4_ = conn._4_4_;
  }
  else {
    conn._4_4_ = Curl_sasl_start(&(paStack_30->imapc).sasl,pCStack_18,false,&local_34);
    if (conn._4_4_ == CURLE_OK) {
      if (local_34 == SASL_INPROGRESS) {
        smtp_state(pCStack_18,SMTP_AUTH);
      }
      else {
        if (((pCStack_18 != (Curl_easy *)0x0) &&
            ((*(ulong *)&(pCStack_18->set).field_0x89c >> 0x1e & 1) != 0)) &&
           (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
            (0 < ((pCStack_18->state).feat)->log_level)))) {
          Curl_infof(pCStack_18,"No known authentication mechanisms supported");
        }
        conn._4_4_ = CURLE_LOGIN_DENIED;
      }
    }
    data_local._4_4_ = conn._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smtp_perform_authentication(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  saslprogress progress;

  /* Check we have enough data to authenticate with, and the
     server supports authentication, and end the connect phase if not */
  if(!smtpc->auth_supported ||
     !Curl_sasl_can_authenticate(&smtpc->sasl, data)) {
    smtp_state(data, SMTP_STOP);
    return result;
  }

  /* Calculate the SASL login details */
  result = Curl_sasl_start(&smtpc->sasl, data, FALSE, &progress);

  if(!result) {
    if(progress == SASL_INPROGRESS)
      smtp_state(data, SMTP_AUTH);
    else {
      /* Other mechanisms not supported */
      infof(data, "No known authentication mechanisms supported");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}